

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

var * __thiscall cs::structure::get_var<cs::var_id_const&>(structure *this,var_id *name)

{
  pointer pcVar1;
  size_t sVar2;
  var *pvVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)(this->m_data).
                        super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &name->m_id);
  if (sVar2 != 0) {
    pvVar3 = domain_type::get_var_no_check
                       ((this->m_data).
                        super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,name)
    ;
    return pvVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::operator+(&local_70,"Struct \"",&this->m_name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_4_ = (undefined4)plVar4[3];
    local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (name->m_id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (name->m_id)._M_string_length);
  std::operator+(&local_50,&local_d0,&local_90);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar4[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  runtime_error::runtime_error(this_00,&local_b0);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var &get_var(T &&name) const
		{
			if (m_data->exist(name))
				return m_data->get_var_no_check(name);
			else
				throw runtime_error("Struct \"" + m_name + "\" have no member called \"" + std::string(name) + "\".");
		}